

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluAdjustBig(word *pF,int nVarsCur,int nVarsMax)

{
  int iVar1;
  int local_1c;
  int nWords;
  int v;
  int nVarsMax_local;
  int nVarsCur_local;
  word *pF_local;
  
  if (nVarsCur != nVarsMax) {
    if (nVarsMax <= nVarsCur) {
      __assert_fail("nVarsCur < nVarsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x18b,"void If_CluAdjustBig(word *, int, int)");
    }
    for (local_1c = Abc_MaxInt(nVarsCur,6); local_1c < nVarsMax; local_1c = local_1c + 1) {
      iVar1 = If_CluWordNum(local_1c);
      If_CluCopy(pF + iVar1,pF,local_1c);
    }
  }
  return;
}

Assistant:

static inline void If_CluAdjustBig( word * pF, int nVarsCur, int nVarsMax )
{
    int v, nWords;
    if ( nVarsCur == nVarsMax )
        return;
    assert( nVarsCur < nVarsMax );
    for ( v = Abc_MaxInt( nVarsCur, 6 ); v < nVarsMax; v++ )
    {
        nWords = If_CluWordNum( v );
        If_CluCopy( pF + nWords, pF, v );
    }
}